

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

uint32_t google::protobuf::compiler::cpp::anon_unknown_0::CalcFieldNum
                   (FieldGenerator *generator,FieldDescriptor *field,Options *options)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Descriptor *descriptor;
  OneofDescriptor *pOVar4;
  Type local_30;
  int type;
  bool is_a_map;
  Options *options_local;
  FieldDescriptor *field_local;
  FieldGenerator *generator_local;
  
  descriptor = FieldDescriptor::containing_type(field);
  bVar1 = IsMapEntryMessage(descriptor);
  local_30 = FieldDescriptor::type(field);
  if ((local_30 == TYPE_STRING) || (local_30 == TYPE_BYTES)) {
    uVar3 = (*generator->_vptr_FieldGenerator[0x16])();
    if ((uVar3 & 1) == 0) {
      bVar2 = IsCord(field,options);
      if (bVar2) {
        local_30 = MAX_TYPE|TYPE_DOUBLE;
      }
      else {
        bVar2 = IsStringPiece(field,options);
        if (bVar2) {
          local_30 = TYPE_SFIXED64|TYPE_UINT64;
        }
      }
    }
    else {
      local_30 = TYPE_SFIXED64|TYPE_INT32;
    }
  }
  pOVar4 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar4 == (OneofDescriptor *)0x0) {
    bVar2 = FieldDescriptor::is_packed(field);
    if (bVar2) {
      generator_local._4_4_ = internal::FieldMetadata::CalculateType(local_30,kPacked);
    }
    else {
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        generator_local._4_4_ = internal::FieldMetadata::CalculateType(local_30,kRepeated);
      }
      else {
        bVar2 = HasHasbit(field);
        if (((bVar2) ||
            (pOVar4 = FieldDescriptor::real_containing_oneof(field),
            pOVar4 != (OneofDescriptor *)0x0)) || (bVar1)) {
          generator_local._4_4_ = internal::FieldMetadata::CalculateType(local_30,kPresence);
        }
        else {
          generator_local._4_4_ = internal::FieldMetadata::CalculateType(local_30,kNoPresence);
        }
      }
    }
  }
  else {
    generator_local._4_4_ = internal::FieldMetadata::CalculateType(local_30,kOneOf);
  }
  return generator_local._4_4_;
}

Assistant:

uint32_t CalcFieldNum(const FieldGenerator& generator,
                      const FieldDescriptor* field, const Options& options) {
  bool is_a_map = IsMapEntryMessage(field->containing_type());
  int type = field->type();
  if (type == FieldDescriptor::TYPE_STRING ||
      type == FieldDescriptor::TYPE_BYTES) {
    // string field
    if (generator.IsInlined()) {
      type = internal::FieldMetadata::kInlinedType;
    } else if (IsCord(field, options)) {
      type = internal::FieldMetadata::kCordType;
    } else if (IsStringPiece(field, options)) {
      type = internal::FieldMetadata::kStringPieceType;
    }
  }

  if (field->real_containing_oneof()) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kOneOf);
  } else if (field->is_packed()) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kPacked);
  } else if (field->is_repeated()) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kRepeated);
  } else if (HasHasbit(field) || field->real_containing_oneof() || is_a_map) {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kPresence);
  } else {
    return internal::FieldMetadata::CalculateType(
        type, internal::FieldMetadata::kNoPresence);
  }
}